

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O3

void __thiscall
NavierStokesBase::manual_tags_placement
          (NavierStokesBase *this,TagBoxArray *tags,
          Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *bf_lev)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  pointer pIVar4;
  Amr *pAVar5;
  pointer pIVar6;
  long lVar7;
  undefined8 uVar8;
  pointer pOVar9;
  bool bVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  BATType BVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  int dir;
  long lVar20;
  long lVar21;
  Box result;
  IntVect hi;
  Box outflowBox;
  Vector<amrex::Orientation,_std::allocator<amrex::Orientation>_> outFaces;
  IntVect low;
  undefined8 local_138;
  IndexType IStack_130;
  uint auStack_12c [2];
  undefined8 uStack_124;
  BATType local_110 [4];
  Box local_100;
  NavierStokesBase *local_e0;
  ulong local_d8;
  uint local_d0;
  Vector<amrex::Orientation,_std::allocator<amrex::Orientation>_> local_c8;
  BoxArray local_a8;
  long local_40;
  Box *local_38;
  
  local_c8.super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
  super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
  super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
  super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0 = this;
  getOutFlowFaces(this,&local_c8);
  if (local_c8.super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
      super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_c8.super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
      super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>._M_impl.
      super__Vector_impl_data._M_start &&
      -1 < (long)local_c8.super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
                 super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)local_c8.super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
                 super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>._M_impl
                 .super__Vector_impl_data._M_start) {
    local_38 = &(local_e0->super_AmrLevel).geom.domain;
    lVar19 = 0;
    do {
      pOVar9 = local_c8.super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
               super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar14 = local_c8.super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
               super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>._M_impl.
               super__Vector_impl_data._M_start[lVar19].val;
      uVar2 = (local_e0->super_AmrLevel).level;
      pIVar4 = (bf_lev->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
               super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
               super__Vector_impl_data._M_start;
      pIVar6 = pIVar4 + (int)uVar2;
      lVar20 = *(long *)(local_38->smallend).vect;
      lVar21 = *(long *)((local_38->smallend).vect + 2);
      lVar7 = *(long *)(local_38->bigend).vect;
      uVar8 = *(undefined8 *)((local_38->bigend).vect + 2);
      auStack_12c[1] = (uint)((ulong)lVar7 >> 0x20);
      uStack_124 = uVar8;
      IStack_130.itype = (uint)lVar21;
      auStack_12c[0] = (uint)((ulong)lVar21 >> 0x20);
      iVar13 = pIVar6->vect[0];
      iVar12 = pIVar6->vect[1];
      local_138._4_4_ = (uint)((ulong)lVar20 >> 0x20);
      uVar17 = local_138._4_4_;
      if (iVar12 == 1 && iVar13 == 1) {
        local_138 = lVar20;
        if (pIVar6->vect[2] != 1) goto LAB_003476a1;
      }
      else {
        local_138._0_4_ = (uint)lVar20;
        if (iVar13 != 1) {
          if (iVar13 == 4) {
            if ((int)(uint)local_138 < 0) {
              local_138._0_4_ = (int)(uint)local_138 >> 2;
            }
            else {
              local_138._0_4_ = (uint)local_138 >> 2;
            }
          }
          else if (iVar13 == 2) {
            if ((int)(uint)local_138 < 0) {
              local_138._0_4_ = (int)(uint)local_138 >> 1;
            }
            else {
              local_138._0_4_ = (uint)local_138 >> 1;
            }
          }
          else if ((int)(uint)local_138 < 0) {
            local_138._0_4_ = ~((int)~(uint)local_138 / iVar13);
          }
          else {
            local_138._0_4_ = (int)(uint)local_138 / iVar13;
          }
        }
        if (iVar12 != 1) {
          if (iVar12 == 4) {
            if (lVar20 < 0) {
              uVar17 = (int)local_138._4_4_ >> 2;
            }
            else {
              uVar17 = local_138._4_4_ >> 2;
            }
          }
          else if (iVar12 == 2) {
            if (lVar20 < 0) {
              uVar17 = (int)local_138._4_4_ >> 1;
            }
            else {
              uVar17 = local_138._4_4_ >> 1;
            }
          }
          else if (lVar20 < 0) {
            uVar17 = ~((int)~local_138._4_4_ / iVar12);
          }
          else {
            uVar17 = (int)local_138._4_4_ / iVar12;
          }
        }
LAB_003476a1:
        local_138 = CONCAT44(uVar17,(uint)local_138);
        iVar3 = pIVar6->vect[2];
        if (iVar3 != 1) {
          if (iVar3 == 4) {
            if ((int)IStack_130.itype < 0) {
              IStack_130.itype = IStack_130.itype >> 2;
            }
            else {
              IStack_130.itype = IStack_130.itype >> 2;
            }
          }
          else if (iVar3 == 2) {
            if ((int)IStack_130.itype < 0) {
              IStack_130.itype = IStack_130.itype >> 1;
            }
            else {
              IStack_130.itype = IStack_130.itype >> 1;
            }
          }
          else if ((int)IStack_130.itype < 0) {
            IStack_130.itype = ~((int)~IStack_130.itype / iVar3);
          }
          else {
            IStack_130.itype = IStack_130.itype / iVar3;
          }
        }
        uStack_124._4_4_ = (uint)((ulong)uVar8 >> 0x20);
        uStack_124._0_4_ = (uint)uVar8;
        if (uStack_124._4_4_ == 0) {
          uVar17 = auStack_12c[0];
          if (iVar13 != 1) {
            if (iVar13 == 4) {
              uVar17 = (int)auStack_12c[0] >> 2;
              if (-1 < lVar21) {
                uVar17 = auStack_12c[0] >> 2;
              }
            }
            else if (iVar13 == 2) {
              uVar17 = (int)auStack_12c[0] >> 1;
              if (-1 < lVar21) {
                uVar17 = auStack_12c[0] >> 1;
              }
            }
            else if (lVar21 < 0) {
              uVar17 = ~((int)~auStack_12c[0] / iVar13);
            }
            else {
              uVar17 = (int)auStack_12c[0] / iVar13;
            }
          }
          auStack_12c[0] = uVar17;
          uVar17 = auStack_12c[1];
          if (iVar12 != 1) {
            if (iVar12 == 4) {
              uVar17 = (int)auStack_12c[1] >> 2;
              if (-1 < lVar7) {
                uVar17 = auStack_12c[1] >> 2;
              }
            }
            else if (iVar12 == 2) {
              uVar17 = (int)auStack_12c[1] >> 1;
              if (-1 < lVar7) {
                uVar17 = auStack_12c[1] >> 1;
              }
            }
            else if (lVar7 < 0) {
              uVar17 = ~((int)~auStack_12c[1] / iVar12);
            }
            else {
              uVar17 = (int)auStack_12c[1] / iVar12;
            }
          }
          auStack_12c[1] = uVar17;
          uVar17 = (uint)uStack_124;
          if (iVar3 != 1) {
            if (iVar3 == 4) {
              uVar17 = (int)(uint)uStack_124 >> 2;
              if (-1 < (int)(uint)uStack_124) {
                uVar17 = (uint)uStack_124 >> 2;
              }
            }
            else if (iVar3 == 2) {
              uVar17 = (int)(uint)uStack_124 >> 1;
              if (-1 < (int)(uint)uStack_124) {
                uVar17 = (uint)uStack_124 >> 1;
              }
            }
            else if ((int)(uint)uStack_124 < 0) {
              uVar17 = ~((int)~(uint)uStack_124 / iVar3);
            }
            else {
              uVar17 = (int)(uint)uStack_124 / iVar3;
            }
          }
        }
        else {
          local_a8.m_bat._0_8_ = 0;
          local_a8.m_bat.m_op.m_bndryReg.m_typ.itype = (IndexType)0;
          lVar20 = 0;
          do {
            if (((uStack_124._4_4_ >> ((uint)lVar20 & 0x1f) & 1) != 0) &&
               ((int)auStack_12c[lVar20] % pIVar6->vect[lVar20] != 0)) {
              (&local_a8.m_bat.m_bat_type)[lVar20] = indexType;
            }
            lVar20 = lVar20 + 1;
          } while (lVar20 != 3);
          uVar17 = auStack_12c[0];
          if (iVar13 != 1) {
            if (iVar13 == 4) {
              uVar17 = (int)auStack_12c[0] >> 2;
              if (-1 < lVar21) {
                uVar17 = auStack_12c[0] >> 2;
              }
            }
            else if (iVar13 == 2) {
              uVar17 = (int)auStack_12c[0] >> 1;
              if (-1 < lVar21) {
                uVar17 = auStack_12c[0] >> 1;
              }
            }
            else if (lVar21 < 0) {
              uVar17 = ~((int)~auStack_12c[0] / iVar13);
            }
            else {
              uVar17 = (int)auStack_12c[0] / iVar13;
            }
          }
          uVar16 = auStack_12c[1];
          if (iVar12 != 1) {
            if (iVar12 == 4) {
              uVar16 = (int)auStack_12c[1] >> 2;
              if (-1 < lVar7) {
                uVar16 = auStack_12c[1] >> 2;
              }
            }
            else if (iVar12 == 2) {
              uVar16 = (int)auStack_12c[1] >> 1;
              if (-1 < lVar7) {
                uVar16 = auStack_12c[1] >> 1;
              }
            }
            else if (lVar7 < 0) {
              uVar16 = ~((int)~auStack_12c[1] / iVar12);
            }
            else {
              uVar16 = (int)auStack_12c[1] / iVar12;
            }
          }
          uVar11 = (uint)uStack_124;
          if (iVar3 != 1) {
            if (iVar3 == 4) {
              uVar11 = (int)(uint)uStack_124 >> 2;
              if (-1 < (int)(uint)uStack_124) {
                uVar11 = (uint)uStack_124 >> 2;
              }
            }
            else if (iVar3 == 2) {
              uVar11 = (int)(uint)uStack_124 >> 1;
              if (-1 < (int)(uint)uStack_124) {
                uVar11 = (uint)uStack_124 >> 1;
              }
            }
            else if ((int)(uint)uStack_124 < 0) {
              uVar11 = ~((int)~(uint)uStack_124 / iVar3);
            }
            else {
              uVar11 = (int)(uint)uStack_124 / iVar3;
            }
          }
          auStack_12c[0] = uVar17 + local_a8.m_bat.m_bat_type;
          auStack_12c[1] = uVar16 + (int)local_a8.m_bat.m_op.m_indexType.m_typ.itype;
          uVar17 = uVar11 + (int)local_a8.m_bat.m_op.m_bndryReg.m_typ.itype;
        }
        uStack_124 = CONCAT44(uStack_124._4_4_,uVar17);
      }
      uVar17 = iVar14 % 3;
      if (do_refine_outflow == 0) {
        if (do_derefine_outflow != 0) {
          local_40 = (long)iVar14;
          lVar20 = (long)(int)uVar17;
          iVar13 = pIVar4->vect[lVar20];
          iVar12 = (Nbuf_outflow / iVar13 + 1) - (uint)(Nbuf_outflow % iVar13 == 0);
          if (0 < (int)uVar2) {
            pAVar5 = (local_e0->super_AmrLevel).parent;
            iVar13 = iVar12 * iVar13;
            pIVar6 = (pAVar5->super_AmrCore).super_AmrMesh.super_AmrInfo.ref_ratio.
                     super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                     super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar21 = 0;
            do {
              local_a8.m_bat._0_8_ = *(long *)((long)pIVar6->vect + lVar21);
              local_a8.m_bat.m_op.m_bndryReg.m_typ.itype =
                   (IndexType)(IndexType)*(uint *)((long)pIVar6->vect + lVar21 + 8);
              iVar12 = iVar13 * (&local_a8.m_bat.m_bat_type)[lVar20] +
                       (pAVar5->super_AmrCore).super_AmrMesh.super_AmrInfo.n_proper;
              iVar13 = *(int *)((long)pIVar4[1].vect + lVar21 + lVar20 * 4);
              iVar12 = (iVar12 / iVar13 + 1) - (uint)(iVar12 % iVar13 == 0);
              iVar13 = iVar13 * iVar12;
              lVar21 = lVar21 + 0xc;
            } while ((ulong)uVar2 * 0xc != lVar21);
          }
          if (0 < iVar12) {
            local_a8.m_bat.m_op.m_bndryReg.m_typ.itype = (IndexType)(IndexType)IStack_130.itype;
            local_a8.m_bat._0_8_ = local_138;
            local_110[2] = (uint)uStack_124;
            local_110[0] = auStack_12c[0];
            local_110[1] = auStack_12c[1];
            if (iVar14 < 3) {
              BVar15 = (&local_a8.m_bat.m_bat_type)[lVar20] - indexType;
              (&local_a8.m_bat.m_bat_type)[lVar20] = BVar15;
              local_110[lVar20] = BVar15;
            }
            else {
              local_d8 = CONCAT44(uStack_124._4_4_ >> 1,uStack_124._4_4_) & 0x100000001;
              local_d0 = uStack_124._4_4_ >> 2 & 1;
              uVar18 = (ulong)uVar17;
              BVar15 = (~*(uint *)((long)&local_d8 + uVar18 * 4) & 1) + local_110[uVar18];
              (&local_a8.m_bat.m_bat_type)[uVar18] = BVar15;
              local_110[uVar18] = BVar15;
            }
            local_100.smallend.vect[2] = (int)local_a8.m_bat.m_op.m_bndryReg.m_typ.itype;
            local_100.smallend.vect._0_8_ = local_a8.m_bat._0_8_;
            local_100.bigend.vect[2] = local_110[2];
            local_100.bigend.vect[0] = local_110[0];
            local_100.bigend.vect[1] = local_110[1];
            local_100.btype.itype = uStack_124._4_4_ & ~(1 << (uVar17 & 0x1f));
            uVar18 = 0;
            do {
              if (uVar17 != uVar18) {
                piVar1 = local_100.smallend.vect + uVar18;
                *piVar1 = *piVar1 + -1;
                piVar1 = local_100.bigend.vect + uVar18;
                *piVar1 = *piVar1 + 1;
              }
              uVar18 = uVar18 + 1;
            } while (uVar18 != 3);
            if (pOVar9[lVar19].val < 3) {
              piVar1 = local_100.bigend.vect + lVar20;
              *piVar1 = *piVar1 + iVar12;
            }
            else {
              piVar1 = local_100.smallend.vect + lVar20;
              *piVar1 = *piVar1 - iVar12;
            }
            amrex::BoxArray::BoxArray(&local_a8,&local_100,1);
            amrex::TagBoxArray::setVal(tags,&local_a8,CLEAR);
            goto LAB_00347bbc;
          }
        }
      }
      else {
        local_a8.m_bat.m_op.m_bndryReg.m_typ.itype = (IndexType)(IndexType)IStack_130.itype;
        local_a8.m_bat._0_8_ = local_138;
        local_110[2] = (uint)uStack_124;
        local_110[0] = auStack_12c[0];
        local_110[1] = auStack_12c[1];
        if (iVar14 < 3) {
          uVar18 = (ulong)(int)uVar17;
          BVar15 = (&local_a8.m_bat.m_bat_type)[uVar18] - indexType;
          (&local_a8.m_bat.m_bat_type)[uVar18] = BVar15;
          local_110[uVar18] = BVar15;
        }
        else {
          local_d8 = CONCAT44(uStack_124._4_4_ >> 1,uStack_124._4_4_) & 0x100000001;
          local_d0 = uStack_124._4_4_ >> 2 & 1;
          uVar18 = (ulong)uVar17;
          BVar15 = (~*(uint *)((long)&local_d8 + uVar18 * 4) & 1) + local_110[uVar18];
          (&local_a8.m_bat.m_bat_type)[uVar18] = BVar15;
          local_110[uVar18] = BVar15;
        }
        iVar14 = (uint)(iVar14 < 3) * 2 + -1;
        local_100.smallend.vect[2] = (int)local_a8.m_bat.m_op.m_bndryReg.m_typ.itype;
        local_100.smallend.vect._0_8_ = local_a8.m_bat._0_8_;
        local_100.bigend.vect[2] = local_110[2];
        local_100.bigend.vect[0] = local_110[0];
        local_100.bigend.vect[1] = local_110[1];
        local_100.btype.itype = uStack_124._4_4_ & ~(1 << (uVar17 & 0x1f));
        piVar1 = local_100.smallend.vect + uVar18;
        *piVar1 = *piVar1 + iVar14;
        piVar1 = local_100.bigend.vect + uVar18;
        *piVar1 = *piVar1 + iVar14;
        bVar10 = amrex::TagBoxArray::hasTags(tags,&local_100);
        if (bVar10) {
          amrex::BoxArray::BoxArray(&local_a8,&local_100,1);
          amrex::TagBoxArray::setVal(tags,&local_a8,SET);
LAB_00347bbc:
          amrex::BoxArray::~BoxArray(&local_a8);
        }
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < (long)local_c8.
                            super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
                            super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_c8.
                            super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
                            super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 2);
  }
  if (local_c8.super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
      super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
                    super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.
                          super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
                          super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.
                          super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
                          super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
NavierStokesBase::manual_tags_placement (TagBoxArray&    tags,
                                         const Vector<IntVect>& bf_lev)
{
    Vector<Orientation> outFaces;
    getOutFlowFaces(outFaces);
    if (outFaces.size()>0)
    {
        for (int i=0; i<outFaces.size(); ++i)
        {
            const Orientation& outFace = outFaces[i];
            const int oDir = outFace.coordDir();
            const Box& crse_domain = amrex::coarsen(geom.Domain(),bf_lev[level]);
            const int mult = (outFace.isLow() ? +1 : -1);
            if (do_refine_outflow)
            {
                //
                // Refine entire outflow boundary if new boxes within grid_tol
                // from outflow
                //
                const int grid_tol = 1;

                Box outflowBox = amrex::adjCell(crse_domain,outFace,grid_tol);

                outflowBox.shift(oDir,mult*grid_tol);

                //
                // Only refine if there are already tagged cells in the outflow
                // region
                //
                bool hasTags = tags.hasTags(outflowBox);
                if (hasTags)
                    tags.setVal(BoxArray(&outflowBox,1),TagBox::SET);
                }
            else if (do_derefine_outflow)
            {
                const int np = parent->nProper();
                //
                // Calculate the number of level 0 cells to be left uncovered
                // at the outflow.  The convoluted logic allows for the fact that
                // the number of uncovered cells must be a multiple of the level
                // blocking factor.  So, when calculating the number of coarse
                // cells below, we always round the division up.
                //
                int N_coarse_cells = Nbuf_outflow / bf_lev[0][oDir];
                if (Nbuf_outflow % bf_lev[0][oDir] != 0)
                    N_coarse_cells++;

                int N_level_cells = N_coarse_cells * bf_lev[0][oDir];

                //
                // Adjust this to get the number of cells to be left uncovered at
                // levels higher than 0
                //
                for (int j = 1; j <= level; ++j)
                {
                    /*** Calculate the minimum cells at this level ***/

                    const int rat = (parent->refRatio(j-1))[oDir];
                    N_level_cells = N_level_cells * rat + np;

                    /*** Calculate the required number of coarse cells ***/

                    N_coarse_cells = N_level_cells / bf_lev[j][oDir];
                    if (N_level_cells % bf_lev[j][oDir] != 0)
                        N_coarse_cells++;

                    /*** Calculate the corresponding number of level cells ***/

                    N_level_cells = N_coarse_cells * bf_lev[j][oDir];
                }
                //
                // Untag the cells near the outflow
                //
                if (N_coarse_cells > 0)
                {
                    //
                    // Generate box at the outflow and grow it in all directions
                    // other than the outflow.  This forces outflow cells in the
                    // ghostcells in directions other that oDir to be cleared.
                    //
                    Box outflowBox = amrex::adjCell(crse_domain, outFace, 1);
                    for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
                        if (dir != oDir) outflowBox.grow(dir, 1);
                    //
                    // Now, grow the box into the domain (opposite direction as
                    // outFace) the number of cells we need to clear.
                    //
                    if (outFace.isLow())
                        outflowBox.growHi(oDir, N_coarse_cells);
                    else
                        outflowBox.growLo(oDir, N_coarse_cells);

                    tags.setVal(BoxArray(&outflowBox,1),TagBox::CLEAR);
                }
            }
        }
    }
}